

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  Cluster **ppCVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Cues *pCVar6;
  Cluster *pCVar7;
  Cluster **ppCVar8;
  Cluster **ppCVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong unaff_R12;
  ulong uVar13;
  char cVar14;
  Cluster **ppCVar15;
  long lVar16;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  long local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  Cluster **local_50;
  longlong local_48;
  long local_40;
  longlong local_38;
  
  local_50 = pResult;
  iVar3 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_68,&local_80);
  if (iVar3 < 0) {
    return (long)iVar3;
  }
  if ((-1 < local_68) && (local_68 < local_80)) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xb21,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  uVar13 = this->m_start + this->m_size;
  local_58 = 0xffffffffffffffff;
  if (this->m_size < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  local_70 = 0;
  do {
    lVar10 = *pos;
    if (-1 < local_68 && local_68 <= lVar10) {
      return 1;
    }
    if (-1 < (long)uVar13 && (long)uVar13 <= lVar10) {
      return 1;
    }
    if (local_80 <= lVar10) {
      *len = 1;
      return -3;
    }
    uVar4 = GetUIntLength(this->m_pReader,lVar10,len);
    if ((long)uVar4 < 0) goto LAB_0012949f;
    if (uVar4 == 0) {
      if ((-1 < (long)uVar13) && ((long)uVar13 < *len + *pos)) goto LAB_001292e5;
      lVar10 = *pos;
      if (local_80 < *len + lVar10) goto LAB_001292c3;
      local_78 = lVar10 - this->m_start;
      uVar4 = ReadID(this->m_pReader,lVar10,len);
      if ((long)uVar4 < 0) {
LAB_0012949f:
        cVar14 = '\x01';
        unaff_R12 = uVar4;
        goto LAB_001294a8;
      }
      if (uVar4 == 0) {
        unaff_R12 = 0xffffffffffffffff;
        cVar14 = '\x01';
        goto LAB_001294a8;
      }
      lVar16 = *pos + *len;
      *pos = lVar16;
      if (local_80 <= lVar16) {
        *len = 1;
        goto LAB_001292c3;
      }
      local_60 = uVar4;
      uVar4 = GetUIntLength(this->m_pReader,lVar16,len);
      if ((long)uVar4 < 0) goto LAB_0012949f;
      if (uVar4 != 0) goto LAB_001292c3;
      if ((-1 < (long)uVar13) && ((long)uVar13 < *len + *pos)) goto LAB_001292e5;
      if (local_80 < *len + *pos) goto LAB_001292c3;
      uVar4 = ReadUInt(this->m_pReader,*pos,len);
      if ((long)uVar4 < 0) {
        cVar14 = '\x01';
        unaff_R12 = uVar4;
      }
      else {
        lVar16 = *len;
        lVar12 = *pos + lVar16;
        *pos = lVar12;
        cVar14 = '\x03';
        if (uVar4 != 0) {
          uVar5 = -1L << ((char)lVar16 * '\a' & 0x3fU) ^ uVar4;
          uVar11 = lVar12 + uVar4;
          if (((-1 < (long)uVar13) && (uVar5 != 0xffffffffffffffff)) &&
             ((long)uVar13 < (long)uVar11)) goto LAB_001292e5;
          if (local_60 == 0x1f43b675) {
            if (uVar5 != 0xffffffffffffffff) {
              local_58 = uVar4;
            }
            cVar14 = '\x02';
            local_70 = local_78;
          }
          else if (local_60 == 0x1c53bb6b) {
            if ((uVar5 == 0xffffffffffffffff) || (-1 < (long)uVar13 && (long)uVar13 < (long)uVar11))
            {
LAB_001292e5:
              cVar14 = '\x01';
              unaff_R12 = 0xfffffffffffffffe;
            }
            else {
              if (this->m_pCues == (Cues *)0x0) {
                local_78 = uVar11;
                local_60 = uVar4;
                local_48 = lVar12;
                pCVar6 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                if (pCVar6 == (Cues *)0x0) {
                  pCVar6 = (Cues *)0x0;
                }
                else {
                  pCVar6->m_pSegment = this;
                  pCVar6->m_start = local_48;
                  pCVar6->m_size = local_60;
                  pCVar6->m_element_start = lVar10;
                  pCVar6->m_element_size = local_78 - lVar10;
                  pCVar6->m_cue_points = (CuePoint **)0x0;
                  pCVar6->m_count = 0;
                  pCVar6->m_preload_count = 0;
                  pCVar6->m_pos = local_48;
                }
                this->m_pCues = pCVar6;
                uVar11 = local_78;
                if (pCVar6 == (Cues *)0x0) {
                  cVar14 = '\x01';
                  unaff_R12 = 0;
                  goto LAB_001294a8;
                }
              }
              *pos = uVar11;
            }
          }
          else {
            if (uVar5 == 0xffffffffffffffff) goto LAB_001292e5;
            *pos = uVar11;
            cVar14 = ((long)uVar13 < 0 || (long)uVar11 <= (long)uVar13) * '\x02' + '\x01';
            if ((long)uVar13 >= 0 && (long)uVar11 > (long)uVar13) {
              unaff_R12 = 0xfffffffffffffffe;
            }
          }
        }
      }
    }
    else {
LAB_001292c3:
      cVar14 = '\x01';
      unaff_R12 = 0xfffffffffffffffd;
    }
LAB_001294a8:
  } while (cVar14 == '\x03');
  if (cVar14 != '\x02') {
    return unaff_R12;
  }
  if (local_70 < 1) {
    __assert_fail("off_next > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xba9,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  local_78 = uVar13 >> 0x3f;
  ppCVar15 = this->m_clusters + this->m_clusterCount;
  ppCVar1 = ppCVar15 + this->m_clusterPreloadCount;
  ppCVar8 = ppCVar1;
  while (ppCVar15 < ppCVar8) {
    ppCVar9 = (Cluster **)
              ((long)ppCVar15 +
              (((long)ppCVar8 - (long)ppCVar15 >> 3) - ((long)ppCVar8 - (long)ppCVar15 >> 0x3f) &
              0xfffffffffffffffeU) * 4);
    if (ppCVar1 <= ppCVar9) {
      __assert_fail("k < jj",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbbe,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    pCVar7 = *ppCVar9;
    if (pCVar7 == (Cluster *)0x0) {
      __assert_fail("pNext",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbc1,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (-1 < pCVar7->m_index) {
      __assert_fail("pNext->m_index < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbc2,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    lVar10 = pCVar7->m_element_start - pCVar7->m_pSegment->m_start;
    if (lVar10 < 0) {
      __assert_fail("pos >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1adb,"long long mkvparser::Cluster::GetPosition() const");
    }
    *pos = lVar10;
    if (lVar10 < local_70) {
      ppCVar15 = ppCVar9 + 1;
      bVar2 = true;
      ppCVar9 = ppCVar8;
    }
    else {
      bVar2 = true;
      if (lVar10 <= local_70) {
        *local_50 = pCVar7;
        bVar2 = false;
        unaff_R12 = 0;
        ppCVar9 = ppCVar8;
      }
    }
    ppCVar8 = ppCVar9;
    if (!bVar2) {
      return unaff_R12;
    }
  }
  if (ppCVar15 != ppCVar8) {
    __assert_fail("i == j",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xbd1,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  lVar10 = Cluster::HasBlockEntries(this,local_70,&local_38,&local_40);
  if (lVar10 < 0) {
    *pos = local_38;
    *len = local_40;
    return lVar10;
  }
  if (lVar10 != 0) {
    pCVar7 = Cluster::Create(this,-1,local_70);
    if (pCVar7 == (Cluster *)0x0) {
      return -1;
    }
    lVar16 = (long)ppCVar15 - (long)this->m_clusters;
    lVar10 = lVar16 >> 3;
    bVar2 = PreloadCluster(this,pCVar7,lVar10);
    if (!bVar2) {
      Cluster::~Cluster(pCVar7);
      operator_delete(pCVar7);
      return -1;
    }
    if (this->m_clusters == (Cluster **)0x0) {
      __assert_fail("m_clusters",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbec,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (this->m_clusterSize <= lVar10) {
      __assert_fail("idx_next < m_clusterSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbed,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (*(Cluster **)((long)this->m_clusters + lVar16) != pCVar7) {
      __assert_fail("m_clusters[idx_next] == pNext",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbee,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    *local_50 = pCVar7;
    return 0;
  }
  uVar4 = local_58;
  if ((long)local_58 < 0) {
    lVar10 = *pos;
    local_70 = lVar10;
    if ((lVar10 < local_68 || local_68 < 0) &&
       (uVar4 = unaff_R12, lVar10 < (long)uVar13 || (char)local_78 != '\0')) {
      do {
        if (local_80 <= lVar10) {
          *len = 1;
          unaff_R12 = 0xfffffffffffffffd;
          uVar4 = 0xffffffffffffffff;
          bVar2 = false;
          goto LAB_00129963;
        }
        unaff_R12 = GetUIntLength(this->m_pReader,lVar10,len);
        iVar3 = 1;
        bVar2 = unaff_R12 != 0;
        if (((long)unaff_R12 < 0) || (unaff_R12 = 0xfffffffffffffffd, bVar2)) {
LAB_0012979e:
          bVar2 = false;
        }
        else {
          if ((-1 < (long)uVar13) && ((long)uVar13 < *len + *pos)) {
LAB_001297f2:
            unaff_R12 = 0xfffffffffffffffe;
            goto LAB_0012979e;
          }
          if ((local_80 < *len + *pos) ||
             (unaff_R12 = ReadID(this->m_pReader,*pos,len), (long)unaff_R12 < 0)) goto LAB_0012979e;
          bVar2 = false;
          if ((unaff_R12 == 0x1c53bb6b) || (unaff_R12 == 0x1f43b675)) {
            iVar3 = 6;
            unaff_R12 = uVar4;
          }
          else {
            lVar10 = *pos + *len;
            *pos = lVar10;
            if (lVar10 < local_80) {
              unaff_R12 = GetUIntLength(this->m_pReader,lVar10,len);
              if ((long)unaff_R12 < 0) goto LAB_0012979e;
              if (unaff_R12 == 0) {
                if ((-1 < (long)uVar13) && ((long)uVar13 < *len + *pos)) goto LAB_001297f2;
                if (*len + *pos <= local_80) {
                  unaff_R12 = ReadUInt(this->m_pReader,*pos,len);
                  if (-1 < (long)unaff_R12) {
                    lVar10 = *len;
                    lVar16 = *pos + lVar10;
                    *pos = lVar16;
                    if (unaff_R12 != 0) {
                      if ((-1L << ((char)lVar10 * '\a' & 0x3fU) ^ unaff_R12) == 0xffffffffffffffff)
                      {
                        bVar2 = false;
                        unaff_R12 = 0xfffffffffffffffe;
                      }
                      else {
                        lVar16 = lVar16 + unaff_R12;
                        bVar2 = false;
                        if (((long)uVar13 < 0) ||
                           (unaff_R12 = 0xfffffffffffffffe, lVar16 <= (long)uVar13)) {
                          *pos = lVar16;
                          bVar2 = true;
                          iVar3 = 0;
                          unaff_R12 = uVar4;
                        }
                      }
                      goto LAB_001297a0;
                    }
                    iVar3 = 7;
                    unaff_R12 = uVar4;
                  }
                  bVar2 = false;
                  goto LAB_001297a0;
                }
              }
            }
            else {
              *len = 1;
            }
            bVar2 = false;
            unaff_R12 = 0xfffffffffffffffd;
          }
        }
LAB_001297a0:
        if ((iVar3 != 0) && (iVar3 != 7)) {
          if (iVar3 != 6) {
            uVar4 = 0xffffffffffffffff;
            goto LAB_00129963;
          }
          break;
        }
        lVar10 = *pos;
        if ((local_68 <= lVar10 && -1 < local_68) ||
           (uVar4 = unaff_R12, (long)uVar13 <= lVar10 && (char)local_78 == '\0')) break;
      } while( true );
    }
    uVar4 = *pos - local_70;
    if ((long)uVar4 < 0) {
      __assert_fail("cluster_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xc53,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    *pos = local_70;
    bVar2 = true;
LAB_00129963:
    if (!bVar2) {
      return unaff_R12;
    }
  }
  lVar10 = *pos;
  *pos = uVar4 + lVar10;
  return (ulong)((long)(uVar4 + lVar10) <= (long)uVar13 || (long)uVar13 < 0) * 4 + -2;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}